

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnforceModuleInstantiationPrefix.cpp
# Opt level: O0

void __thiscall
enforce_module_instantiation_prefix::MainVisitor::handle(MainVisitor *this,InstanceSymbol *instance)

{
  string_view arg;
  string_view arg_00;
  bool bVar1;
  iterator iVar2;
  Symbol *pSVar3;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2;
  string_view prefix;
  TidyVisitor *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  iterator *in_stack_ffffffffffffff48;
  SourceLocation in_stack_ffffffffffffff58;
  Scope *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Diagnostic *this_00;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_50;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_40;
  __sv_type local_38;
  SourceLocation in_stack_ffffffffffffffe0;
  
  slang::not_null<const_slang::SourceManager_*>::operator->
            ((not_null<const_slang::SourceManager_*> *)0x25efe9);
  slang::SourceManager::getFileName(*(SourceManager **)(in_RSI + 0x18),in_stack_ffffffffffffffe0);
  bVar1 = TidyVisitor::skip(in_stack_000000d0,(string_view)in_stack_000000d8);
  if ((!bVar1) && (bVar1 = slang::ast::InstanceSymbol::isModule((InstanceSymbol *)0x25f04f), bVar1))
  {
    TidyConfig::getCheckConfigs((TidyConfig *)(in_RDI->field_2)._M_allocated_capacity);
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    local_50 = slang::ast::Scope::members(in_stack_ffffffffffffff60);
    local_40 = &local_50;
    std::ranges::
    subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
    ::begin(local_40);
    iVar2 = std::ranges::
            subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
            ::end(local_40);
    while (bVar1 = slang::operator==<slang::ast::Scope::iterator>
                             ((self_type *)in_RDI,in_stack_ffffffffffffff48),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pSVar3 = slang::iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                         ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x25f0f0);
      if (pSVar3->kind == Instance) {
        this_00 = (Diagnostic *)local_38._M_str;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),local_38);
        if (!bVar1) {
          in_stack_ffffffffffffff84 = 0x20010;
          slang::Diagnostics::add
                    ((Diagnostics *)in_RDI,SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0),
                     in_stack_ffffffffffffff58);
          arg._M_str = (char *)iVar2.current;
          arg._M_len = (size_t)pSVar3;
          slang::Diagnostic::operator<<(this_00,arg);
          arg_00._M_str = (char *)iVar2.current;
          arg_00._M_len = (size_t)pSVar3;
          in_stack_ffffffffffffff58 = (SourceLocation)local_38._M_len;
          in_stack_ffffffffffffff60 = (Scope *)local_38._M_str;
          slang::Diagnostic::operator<<(this_00,arg_00);
        }
      }
      slang::iterator_facade<slang::ast::Scope::iterator,_false>::
      operator++<slang::ast::Scope::iterator>
                ((iterator_facade<slang::ast::Scope::iterator,_false> *)in_RDI);
    }
  }
  return;
}

Assistant:

void handle(const InstanceSymbol& instance) {
        NEEDS_SKIP_SYMBOL(instance)

        if (!instance.isModule())
            return;

        std::string_view prefix = config.getCheckConfigs().moduleInstantiationPrefix;
        for (auto& member : instance.body.members()) {
            if (member.kind == SymbolKind::Instance && !member.name.starts_with(prefix)) {
                diags.add(diag::EnforcePortSuffix, member.location) << member.name << prefix;
            }
        }
    }